

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O2

ptr<snapshot> __thiscall calc_server::calc_state_machine::last_snapshot(calc_state_machine *this)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<snapshot> pVar2;
  ptr<snapshot_ctx> ctx;
  __shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x48))->__data);
  if ((_Rb_tree_node_base *)(in_RSI + 0x20) == *(_Rb_tree_node_base **)(in_RSI + 0x30)) {
    (this->super_state_machine)._vptr_state_machine = (_func_int **)0x0;
    (this->cur_value_).super___atomic_base<long>._M_i = 0;
  }
  else {
    lVar1 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(in_RSI + 0x20));
    std::__shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_28,
                 (__shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2>
                  *)(lVar1 + 0x28));
    std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)local_28._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x48));
  pVar2.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<snapshot>)pVar2.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> last_snapshot() {
        // Just return the latest snapshot.
        std::lock_guard<std::mutex> ll(snapshots_lock_);
        auto entry = snapshots_.rbegin();
        if (entry == snapshots_.rend()) return nullptr;

        ptr<snapshot_ctx> ctx = entry->second;
        return ctx->snapshot_;
    }